

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
ComparisonBase<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::AnyEq>
::
Impl<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::MatchAndExplain(Impl<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
                 MatchResultListener *param_2)

{
  size_t __n;
  int iVar1;
  
  __n = lhs->_M_len;
  if (__n != (this->rhs_)._M_string_length) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp(lhs->_M_str,(this->rhs_)._M_dataplus._M_p,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

bool operator()(const A& a, const B& b) const { return a == b; }